

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecCombineDec(Sfm_Dec_t *p,word *pTruth0,word *pTruth1,int *pSupp0,int *pSupp1,int nSupp0,
                     int nSupp1,word *pTruth,int *pSupp,int Var)

{
  size_t __n;
  word *pwVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  Vec_Int_t vVec;
  
  vVec.nCap = 0x10;
  vVec.nSize = 0;
  vVec.pArray = pSupp;
  iVar9 = 1 << ((char)nSupp0 - 6U & 0x1f);
  if (nSupp0 < 7) {
    iVar9 = 1;
  }
  if (nSupp0 == nSupp1) {
    __n = (long)nSupp0 * 4;
    iVar3 = bcmp(pSupp0,pSupp1,__n);
    if (iVar3 == 0) {
      iVar3 = bcmp(pTruth0,pTruth1,(long)iVar9 << 3);
      if (iVar3 == 0) {
        memcpy(pSupp,pSupp0,__n);
        memcpy(pTruth,pTruth0,(long)iVar9 << 3);
        goto LAB_00402194;
      }
    }
  }
  uVar5 = 0;
  piVar6 = pSupp1;
  piVar10 = pSupp0;
  while ((piVar10 < pSupp0 + nSupp0 && (piVar6 < pSupp1 + nSupp1))) {
    iVar9 = *piVar10;
    iVar3 = *piVar6;
    if (iVar9 == iVar3) {
      piVar10 = piVar10 + 1;
      *(int *)((long)pSupp + uVar5) = iVar9;
      piVar6 = piVar6 + 1;
    }
    else if (iVar9 < iVar3) {
      piVar10 = piVar10 + 1;
      *(int *)((long)pSupp + uVar5) = iVar9;
    }
    else {
      piVar6 = piVar6 + 1;
      *(int *)((long)pSupp + uVar5) = iVar3;
    }
    uVar5 = uVar5 + 4;
  }
  for (; piVar10 < pSupp0 + nSupp0; piVar10 = piVar10 + 1) {
    *(int *)((long)pSupp + uVar5) = *piVar10;
    uVar5 = uVar5 + 4;
  }
  for (; piVar6 < pSupp1 + nSupp1; piVar6 = piVar6 + 1) {
    *(int *)((long)pSupp + uVar5) = *piVar6;
    uVar5 = uVar5 + 4;
  }
  uVar4 = (uint)(uVar5 >> 2);
  vVec.nSize = uVar4;
  if (0x10 < (int)uVar4) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar4 < nSupp0) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar4 < nSupp1) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  piVar6 = pSupp;
  if (uVar4 == 0x10) {
    Vec_IntGrow(&vVec,0x20);
    piVar6 = vVec.pArray;
    uVar4 = vVec.nSize;
  }
  iVar9 = uVar4 + 1;
  vVec.nSize = iVar9;
  for (uVar5 = (ulong)uVar4;
      (uVar8 = (int)uVar4 >> 0x1f & uVar4, 0 < (int)(uint)uVar5 &&
      (uVar8 = (uint)uVar5, Var < piVar6[uVar5 - 1])); uVar5 = uVar5 - 1) {
    piVar6[uVar5] = piVar6[uVar5 - 1];
  }
  piVar6[(int)uVar8] = Var;
  if (p->pPars->nVarMax <= (int)uVar4) {
    return -2;
  }
  Abc_TtStretch6(pTruth0,nSupp0,iVar9);
  Abc_TtStretch6(pTruth1,nSupp1,iVar9);
  Abc_TtExpand(pTruth0,iVar9,pSupp0,nSupp0,pSupp,iVar9);
  Abc_TtExpand(pTruth1,iVar9,pSupp1,nSupp1,pSupp,iVar9);
  iVar3 = Vec_IntFind(&vVec,Var);
  bVar2 = (char)uVar4 - 5U & 0x1f;
  uVar7 = 0;
  uVar5 = (ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    uVar5 = uVar7;
  }
  pwVar1 = p->pTtElems[iVar3];
  if ((int)uVar4 < 6) {
    uVar5 = 1;
  }
  for (; nSupp0 = iVar9, uVar5 != uVar7; uVar7 = uVar7 + 1) {
    pTruth[uVar7] = (pTruth1[uVar7] ^ pTruth0[uVar7]) & pwVar1[uVar7] ^ pTruth0[uVar7];
  }
LAB_00402194:
  Abc_TtStretch6(pTruth,nSupp0,p->pPars->nVarMax);
  return nSupp0;
}

Assistant:

int Sfm_DecCombineDec( Sfm_Dec_t * p, word * pTruth0, word * pTruth1, int * pSupp0, int * pSupp1, int nSupp0, int nSupp1, word * pTruth, int * pSupp, int Var )
{
    Vec_Int_t vVec0 = { 2*SFM_SUPP_MAX, nSupp0, pSupp0 };
    Vec_Int_t vVec1 = { 2*SFM_SUPP_MAX, nSupp1, pSupp1 };
    Vec_Int_t vVec  = { 2*SFM_SUPP_MAX, 0,      pSupp  };
    int nWords0 = Abc_TtWordNum(nSupp0);
    int nSupp, iSuppVar;
    // check the case of equal cofactors
    if ( nSupp0 == nSupp1 && !memcmp(pSupp0, pSupp1, sizeof(int)*nSupp0) && !memcmp(pTruth0, pTruth1, sizeof(word)*nWords0) )
    {
        memcpy( pSupp,  pSupp0,  sizeof(int)*nSupp0   );
        memcpy( pTruth, pTruth0, sizeof(word)*nWords0 );
        Abc_TtStretch6( pTruth, nSupp0, p->pPars->nVarMax );
        return nSupp0;
    }
    // merge support variables
    Vec_IntTwoMerge2Int( &vVec0, &vVec1, &vVec );
    Vec_IntPushOrder( &vVec, Var );
    nSupp = Vec_IntSize( &vVec );
    if ( nSupp > p->pPars->nVarMax )
        return -2;
    // expand truth tables
    Abc_TtStretch6( pTruth0, nSupp0, nSupp );
    Abc_TtStretch6( pTruth1, nSupp1, nSupp );
    Abc_TtExpand( pTruth0, nSupp, pSupp0, nSupp0, pSupp, nSupp );
    Abc_TtExpand( pTruth1, nSupp, pSupp1, nSupp1, pSupp, nSupp );
    // perform operation
    iSuppVar = Vec_IntFind( &vVec, Var );
    Abc_TtMux( pTruth, p->pTtElems[iSuppVar], pTruth1, pTruth0, Abc_TtWordNum(nSupp) );
    Abc_TtStretch6( pTruth, nSupp, p->pPars->nVarMax );
    return nSupp;
}